

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

ValueType * __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<1>::find_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,pair<int,_int> *key)

{
  uint8_t pos_00;
  bool bVar1;
  uint16_t chunks;
  int iVar2;
  reference pvVar3;
  reference this_00;
  int in_EDX;
  uint16_t *in_RSI;
  pair<int,_int> *in_RDI;
  int pos;
  uint8_t hashChunk;
  uint16_t hash;
  undefined4 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  pair<int,_int> *key_00;
  InnerLeaf<1> *in_stack_fffffffffffffff8;
  double *pdVar4;
  
  key_00 = in_RDI;
  chunks = get_hash_chunks16((uint64_t)in_RSI,in_EDX);
  pos_00 = get_first_chunk16(chunks);
  bVar1 = Occupation::test((Occupation *)in_RDI,pos_00);
  if (bVar1) {
    iVar2 = Occupation::num_set_until
                      ((Occupation *)
                       CONCAT26(chunks,CONCAT15(pos_00,CONCAT14(in_stack_ffffffffffffffd4,
                                                                in_stack_ffffffffffffffd0))),
                       (uint8_t)((ulong)in_RDI >> 0x38));
    iVar2 = iVar2 + -1;
    while( true ) {
      pvVar3 = std::array<unsigned_long,_7UL>::operator[]
                         ((array<unsigned_long,_7UL> *)
                          CONCAT26(chunks,CONCAT15(pos_00,CONCAT14(in_stack_ffffffffffffffd4,iVar2))
                                  ),(size_type)in_RDI);
      if (*pvVar3 <= (ulong)chunks) break;
      iVar2 = iVar2 + 1;
    }
    bVar1 = find_key(in_stack_fffffffffffffff8,key_00,in_RSI,
                     (int *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    if (bVar1) {
      this_00 = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL>::operator[]
                          ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL> *)
                           CONCAT26(chunks,CONCAT15(pos_00,CONCAT14(in_stack_ffffffffffffffd4,iVar2)
                                                   )),(size_type)in_RDI);
      pdVar4 = HighsHashTableEntry<std::pair<int,_int>,_double>::value(this_00);
    }
    else {
      pdVar4 = (double *)0x0;
    }
  }
  else {
    pdVar4 = (double *)0x0;
  }
  return pdVar4;
}

Assistant:

ValueType* find_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return nullptr;

      int pos = occupation.num_set_until(hashChunk) - 1;
      while (hashes[pos] > hash) ++pos;

      if (find_key(key, hash, pos)) return &entries[pos].value();

      return nullptr;
    }